

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  uint uVar1;
  uchar local_11;
  symbol_codec *local_10;
  symbol_codec *this_local;
  
  local_10 = this;
  do {
    local_11 = (uchar)(this->m_arith_base >> 0x18);
    vector<unsigned_char>::push_back(&this->m_arith_output_buf,&local_11);
    this->m_total_bits_written = this->m_total_bits_written + 8;
    this->m_arith_base = this->m_arith_base << 8;
    uVar1 = this->m_arith_length << 8;
    this->m_arith_length = uVar1;
  } while (uVar1 < 0x1000000);
  return;
}

Assistant:

void symbol_codec::arith_renorm_enc_interval()
    {
        do
        {
            m_arith_output_buf.push_back((m_arith_base >> 24) & 0xFF);
            m_total_bits_written += 8;

            m_arith_base <<= 8;
        } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
    }